

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-test-data.cc
# Opt level: O3

string * bool_to_str_abi_cxx11_(string *__return_storage_ptr__,bool v)

{
  char *pcVar1;
  undefined7 in_register_00000031;
  
  pcVar1 = "false";
  if ((int)CONCAT71(in_register_00000031,v) != 0) {
    pcVar1 = "true";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (CONCAT71(in_register_00000031,v) & 0xffffffff ^ 5));
  return __return_storage_ptr__;
}

Assistant:

std::string bool_to_str(bool v) { 
  return v ? "true" : "false"; 
}